

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexImage2DAlignCase::createTexture(TexImage2DAlignCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  int level;
  uint width;
  uint height;
  uint uVar6;
  uint rowPitch;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  Vec4 colorB;
  Vec4 colorA;
  PixelBufferAccess local_58;
  
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  if (0 < (this->super_Texture2DSpecCase).m_numLevels) {
    this_01 = &(this->super_Texture2DSpecCase).m_texFormat;
    level = 0;
    do {
      width = (this->super_Texture2DSpecCase).m_width >> ((byte)level & 0x1f);
      height = (this->super_Texture2DSpecCase).m_height >> ((byte)level & 0x1f);
      fVar1 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[0];
      fVar2 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[1];
      fVar3 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[2];
      fVar4 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[3];
      if ((int)width < 2) {
        width = 1;
      }
      colorA.m_data[0] =
           ((this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[0] - fVar1) * 1.0 +
           fVar1;
      colorA.m_data[1] =
           ((this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[1] - fVar2) * 0.0 +
           fVar2;
      colorA.m_data[2] =
           ((this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[2] - fVar3) * 0.0 +
           fVar3;
      colorA.m_data[3] =
           ((this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[3] - fVar4) * 1.0 +
           fVar4;
      fVar1 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[0];
      fVar2 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[1];
      fVar3 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[2];
      fVar4 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[3];
      colorB.m_data[0] =
           ((this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[0] - fVar1) * 0.0 +
           fVar1;
      colorB.m_data[1] =
           ((this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[1] - fVar2) * 1.0 +
           fVar2;
      colorB.m_data[2] =
           ((this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[2] - fVar3) * 0.0 +
           fVar3;
      colorB.m_data[3] =
           ((this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[3] - fVar4) * 1.0 +
           fVar4;
      if ((int)height < 2) {
        height = 1;
      }
      iVar5 = tcu::TextureFormat::getPixelSize(this_01);
      rowPitch = -this->m_alignment & (iVar5 * width + this->m_alignment) - 1;
      uVar6 = height >> 2;
      if (width >> 2 < height >> 2) {
        uVar6 = width >> 2;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&data,(long)(int)(rowPitch * height));
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_58,this_01,width,height,1,rowPitch,0,
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      tcu::fillWithGrid(&local_58,uVar6 + (uVar6 == 0),&colorA,&colorB);
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,level,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,width,
                 height,0,this->m_format,this->m_dataType,
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
      level = level + 1;
    } while (level < (this->super_Texture2DSpecCase).m_numLevels);
    if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			int		rowPitch	= deAlign32(levelW*m_texFormat.getPixelSize(), m_alignment);
			int		cellSize	= de::max(1, de::min(levelW >> 2, levelH >> 2));

			data.resize(rowPitch*levelH);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, levelW, levelH, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, &data[0]);
		}
	}